

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error TT_Vary_Apply_Glyph_Deltas(TT_Loader loader,FT_Outline *outline,FT_Vector *unrounded)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ushort uVar4;
  TT_Face pTVar5;
  FT_ULong FVar6;
  FT_ULong pos;
  long lVar7;
  undefined8 uVar8;
  FT_Pos FVar9;
  GX_Blend pGVar10;
  FT_UInt16 FVar11;
  FT_UInt16 FVar12;
  FT_Error FVar13;
  int iVar14;
  FT_Vector *pFVar15;
  FT_Vector *P;
  FT_Fixed *pFVar16;
  uchar *puVar17;
  uchar *puVar18;
  FT_Memory pFVar19;
  FT_Bool *pFVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  FT_Fixed *pFVar25;
  uint uVar26;
  long lVar27;
  FT_UShort *P_00;
  FT_Stream pFVar28;
  FT_Error error;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_Error local_120;
  uint local_11c;
  FT_Memory local_118;
  FT_Fixed *local_110;
  FT_Stream local_108;
  FT_UInt16 local_fa;
  FT_Vector *local_f8;
  GX_Blend local_f0;
  FT_Vector *local_e8;
  FT_Pointer local_e0;
  ulong local_d8;
  FT_Pointer local_d0;
  ulong local_c8;
  FT_Bool *local_c0;
  FT_UShort *local_b8;
  ulong local_b0;
  FT_Outline *local_a8;
  FT_UInt local_a0;
  uint local_9c;
  FT_UShort *local_98;
  FT_Fixed *local_90;
  FT_Fixed *local_88;
  FT_Fixed *local_80;
  FT_UShort *local_78;
  FT_Fixed local_70;
  ulong local_68;
  ulong local_60;
  TT_Loader local_58;
  uchar *local_50;
  uchar *local_48;
  long local_40;
  long local_38;
  
  pTVar5 = loader->face;
  local_108 = (pTVar5->root).stream;
  local_118 = local_108->memory;
  uVar26 = loader->glyph_index;
  local_b0 = (ulong)(uint)(int)outline->n_points;
  local_f0 = pTVar5->blend;
  local_a0 = 0;
  FVar13 = 6;
  if (local_f0 != (GX_Blend)0x0 && pTVar5->doblend != '\0') {
    local_11c = (int)outline->n_points + 4;
    if (local_11c != 0) {
      pFVar15 = outline->points;
      lVar22 = 0;
      do {
        *(long *)((long)&unrounded->x + lVar22) = *(long *)((long)&pFVar15->x + lVar22) << 6;
        *(long *)((long)&unrounded->y + lVar22) = *(long *)((long)&pFVar15->y + lVar22) << 6;
        lVar22 = lVar22 + 0x10;
      } while ((ulong)local_11c << 4 != lVar22);
    }
    FVar13 = 0;
    if ((uVar26 < local_f0->gv_glyphcnt) &&
       (FVar13 = 0, local_f0->glyphoffsets[uVar26] != local_f0->glyphoffsets[uVar26 + 1])) {
      uVar24 = (ulong)local_11c;
      local_c0 = (FT_Bool *)0x0;
      local_a8 = outline;
      local_58 = loader;
      pFVar15 = (FT_Vector *)ft_mem_realloc(local_118,0x10,0,uVar24,(void *)0x0,&local_120);
      pFVar19 = local_118;
      P = (FT_Vector *)0x0;
      if (local_120 == 0) {
        local_f8 = pFVar15;
        P = (FT_Vector *)ft_mem_realloc(local_118,0x10,0,uVar24,(void *)0x0,&local_120);
        if (local_120 == 0) {
          local_e8 = P;
          local_c0 = (FT_Bool *)ft_mem_realloc(pFVar19,1,0,uVar24,(void *)0x0,&local_120);
          pFVar28 = local_108;
          pFVar15 = local_f8;
          pFVar19 = local_118;
          P = local_e8;
          if (local_120 == 0) {
            FVar6 = local_f0->glyphoffsets[uVar26 + 1];
            pos = local_f0->glyphoffsets[uVar26];
            local_120 = FT_Stream_Seek(local_108,pos);
            pFVar15 = local_f8;
            pFVar19 = local_118;
            P = local_e8;
            if (local_120 == 0) {
              pFVar25 = (FT_Fixed *)(FVar6 - pos);
              local_120 = FT_Stream_EnterFrame(pFVar28,(FT_ULong)pFVar25);
              pFVar15 = local_f8;
              pFVar19 = local_118;
              P = local_e8;
              if (local_120 == 0) {
                puVar18 = pFVar28->cursor;
                puVar17 = pFVar28->base;
                local_110 = pFVar25;
                local_d8 = uVar24;
                local_80 = (FT_Fixed *)
                           ft_mem_realloc(local_118,8,0,(ulong)local_f0->num_axis,(void *)0x0,
                                          &local_120);
                pGVar10 = local_f0;
                pFVar25 = (FT_Fixed *)0x0;
                pFVar16 = (FT_Fixed *)0x0;
                P_00 = (FT_UShort *)0x0;
                if (local_120 == 0) {
                  local_c8 = (long)puVar18 - (long)puVar17;
                  pFVar25 = (FT_Fixed *)
                            ft_mem_realloc(local_118,8,0,(ulong)local_f0->num_axis,(void *)0x0,
                                           &local_120);
                  if (local_120 == 0) {
                    pFVar16 = (FT_Fixed *)
                              ft_mem_realloc(local_118,8,0,(ulong)pGVar10->num_axis,(void *)0x0,
                                             &local_120);
                    pFVar28 = local_108;
                    if (local_120 == 0) {
                      local_90 = pFVar16;
                      local_88 = pFVar25;
                      FVar11 = FT_Stream_GetUShort(local_108);
                      FVar12 = FT_Stream_GetUShort(pFVar28);
                      pFVar28 = local_108;
                      if ((local_110 < (FT_Fixed *)(ulong)FVar12) ||
                         (local_60 = (ulong)(FVar11 & 0xfff),
                         local_110 < (FT_Fixed *)(ulong)((FVar11 & 0xfff) * 4))) {
                        local_120 = 8;
                        pFVar25 = local_88;
                        pFVar16 = local_90;
                        P_00 = (FT_UShort *)0x0;
                      }
                      else {
                        local_c8 = local_c8 + (long)(ulong)FVar12;
                        if ((short)FVar11 < 0) {
                          puVar18 = local_108->base;
                          uVar24 = (long)local_108->cursor - (long)puVar18;
                          puVar17 = puVar18 + local_c8;
                          if ((ulong)((long)local_108->limit - (long)puVar18) <= local_c8) {
                            puVar17 = local_108->limit;
                          }
                          local_108->cursor = puVar17;
                          local_78 = ft_var_readpackedpoints
                                               (local_108,local_f0->gvar_size,&local_a0);
                          puVar18 = pFVar28->base;
                          local_c8 = (long)pFVar28->cursor - (long)puVar18;
                          puVar17 = puVar18 + uVar24;
                          if ((ulong)((long)pFVar28->limit - (long)puVar18) <= uVar24) {
                            puVar17 = pFVar28->limit;
                          }
                          pFVar28->cursor = puVar17;
                        }
                        else {
                          local_78 = (FT_UShort *)0x0;
                        }
                        local_e0 = (FT_Pointer)0x0;
                        local_d0 = ft_mem_realloc(local_118,8,0,local_d8,(void *)0x0,&local_120);
                        if ((local_120 == 0) &&
                           (local_e0 = ft_mem_realloc(local_118,8,0,local_d8,(void *)0x0,&local_120)
                           , local_120 == 0)) {
                          if (local_11c != 0) {
                            pFVar15 = local_a8->points;
                            lVar22 = 0;
                            do {
                              *(long *)((long)&local_f8->x + lVar22) =
                                   *(long *)((long)&pFVar15->x + lVar22) << 0x10;
                              *(long *)((long)&local_f8->y + lVar22) =
                                   *(long *)((long)&pFVar15->y + lVar22) << 0x10;
                              lVar22 = lVar22 + 0x10;
                            } while (local_d8 << 4 != lVar22);
                          }
                          if ((uint)local_60 != 0) {
                            local_38 = local_d8 << 4;
                            local_40 = local_d8 * 8;
                            local_68 = 0;
                            local_b8 = (FT_UShort *)0x0;
                            do {
                              pFVar28 = local_108;
                              local_fa = FT_Stream_GetUShort(local_108);
                              FVar11 = FT_Stream_GetUShort(pFVar28);
                              pFVar25 = local_80;
                              pGVar10 = local_f0;
                              pFVar28 = local_108;
                              local_110 = (FT_Fixed *)CONCAT44(local_110._4_4_,(uint)FVar11);
                              if ((short)FVar11 < 0) {
                                if (local_f0->num_axis != 0) {
                                  uVar24 = 0;
                                  do {
                                    FVar11 = FT_Stream_GetUShort(pFVar28);
                                    pFVar25[uVar24] = (long)(short)FVar11 << 2;
                                    uVar24 = uVar24 + 1;
                                  } while (uVar24 < pGVar10->num_axis);
                                }
LAB_0025e629:
                                pFVar16 = local_88;
                                pFVar25 = local_90;
                                if (((uint)local_110 >> 0xe & 1) != 0) {
                                  if (pGVar10->num_axis != 0) {
                                    uVar24 = 0;
                                    do {
                                      FVar11 = FT_Stream_GetUShort(pFVar28);
                                      pFVar16[uVar24] = (long)(short)FVar11 << 2;
                                      uVar24 = uVar24 + 1;
                                    } while (uVar24 < pGVar10->num_axis);
                                  }
                                  pFVar25 = local_90;
                                  if (pGVar10->num_axis != 0) {
                                    uVar24 = 0;
                                    do {
                                      FVar11 = FT_Stream_GetUShort(pFVar28);
                                      pFVar25[uVar24] = (long)(short)FVar11 << 2;
                                      uVar24 = uVar24 + 1;
                                    } while (uVar24 < pGVar10->num_axis);
                                  }
                                }
                                local_70 = ft_var_apply_tuple(pGVar10,(FT_UShort)local_110,local_80,
                                                              local_88,pFVar25);
                                if (local_70 == 0) {
                                  local_c8 = local_c8 + local_fa;
                                  iVar14 = 0x13;
                                }
                                else {
                                  local_50 = local_108->base;
                                  local_48 = local_108->cursor;
                                  puVar18 = local_50 + local_c8;
                                  if ((ulong)((long)local_108->limit - (long)local_50) <= local_c8)
                                  {
                                    puVar18 = local_108->limit;
                                  }
                                  local_108->cursor = puVar18;
                                  if (((uint)local_110 >> 0xd & 1) == 0) {
                                    local_9c = local_a0;
                                    local_98 = local_78;
                                  }
                                  else {
                                    local_98 = ft_var_readpackedpoints
                                                         (local_108,local_f0->gvar_size,&local_9c);
                                    local_b8 = local_98;
                                  }
                                  pGVar10 = local_f0;
                                  pFVar28 = local_108;
                                  uVar24 = (ulong)local_9c;
                                  uVar26 = local_9c;
                                  if (uVar24 == 0) {
                                    uVar26 = local_11c;
                                  }
                                  local_110 = ft_var_readpackeddeltas
                                                        (local_108,local_f0->gvar_size,uVar26);
                                  pFVar25 = ft_var_readpackeddeltas
                                                      (pFVar28,pGVar10->gvar_size,uVar26);
                                  if (((local_98 != (FT_UShort *)0x0) &&
                                      (pFVar25 != (FT_Fixed *)0x0)) &&
                                     (local_110 != (FT_Fixed *)0x0)) {
                                    if (local_98 == (FT_UShort *)0xffffffffffffffff) {
                                      if (local_11c != 0) {
                                        uVar24 = 0;
                                        do {
                                          lVar23 = (long)(int)local_110[uVar24] *
                                                   (long)(int)local_70;
                                          lVar27 = (long)(int)pFVar25[uVar24] * (long)(int)local_70;
                                          lVar22 = *(long *)((long)local_e0 + uVar24 * 8);
                                          plVar3 = (long *)((long)local_d0 + uVar24 * 8);
                                          *plVar3 = *plVar3 + (long)(int)((ulong)(lVar23 + 0x8000 +
                                                                                 (lVar23 >> 0x3f))
                                                                         >> 0x10);
                                          *(long *)((long)local_e0 + uVar24 * 8) =
                                               (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >>
                                                    0x10) + lVar22;
                                          uVar24 = uVar24 + 1;
                                        } while (local_d8 != uVar24);
                                      }
                                    }
                                    else {
                                      if (local_11c != 0) {
                                        lVar22 = 0;
                                        pFVar20 = local_c0;
                                        do {
                                          *pFVar20 = '\0';
                                          puVar1 = (undefined8 *)((long)&local_f8->x + lVar22);
                                          uVar8 = puVar1[1];
                                          puVar2 = (undefined8 *)((long)&local_e8->x + lVar22);
                                          *puVar2 = *puVar1;
                                          puVar2[1] = uVar8;
                                          pFVar20 = pFVar20 + 1;
                                          lVar22 = lVar22 + 0x10;
                                        } while (local_38 != lVar22);
                                      }
                                      if (uVar24 != 0) {
                                        uVar21 = 0;
                                        do {
                                          uVar4 = local_98[uVar21];
                                          if (uVar4 < local_11c) {
                                            local_c0[uVar4] = '\x01';
                                            lVar22 = (long)(int)local_110[uVar21] *
                                                     (long)(int)local_70;
                                            local_e8[uVar4].x =
                                                 local_e8[uVar4].x +
                                                 (long)(int)((ulong)(lVar22 + 0x8000 +
                                                                    (lVar22 >> 0x3f)) >> 0x10);
                                            lVar22 = (long)(int)pFVar25[uVar21] *
                                                     (long)(int)local_70;
                                            local_e8[uVar4].y =
                                                 local_e8[uVar4].y +
                                                 (long)(int)((ulong)(lVar22 + 0x8000 +
                                                                    (lVar22 >> 0x3f)) >> 0x10);
                                          }
                                          uVar21 = uVar21 + 1;
                                        } while (uVar24 != uVar21);
                                      }
                                      tt_interpolate_deltas(local_a8,local_e8,local_f8,local_c0);
                                      if (local_11c != 0) {
                                        lVar22 = 0;
                                        do {
                                          lVar23 = *(long *)((long)&local_e8->y + lVar22 * 2);
                                          lVar27 = *(long *)((long)local_e0 + lVar22);
                                          lVar7 = *(long *)((long)&local_f8->y + lVar22 * 2);
                                          *(long *)((long)local_d0 + lVar22) =
                                               (*(long *)((long)&local_e8->x + lVar22 * 2) +
                                               *(long *)((long)local_d0 + lVar22)) -
                                               *(long *)((long)&local_f8->x + lVar22 * 2);
                                          *(long *)((long)local_e0 + lVar22) =
                                               (lVar23 + lVar27) - lVar7;
                                          lVar22 = lVar22 + 8;
                                        } while (local_40 != lVar22);
                                      }
                                    }
                                  }
                                  if (local_b8 == (FT_UShort *)0xffffffffffffffff) {
                                    local_b8 = (FT_UShort *)0xffffffffffffffff;
                                  }
                                  else {
                                    ft_mem_free(local_118,local_b8);
                                    local_b8 = (FT_UShort *)0x0;
                                  }
                                  pFVar19 = local_118;
                                  uVar24 = (long)local_48 - (long)local_50;
                                  ft_mem_free(local_118,local_110);
                                  ft_mem_free(pFVar19,pFVar25);
                                  local_c8 = local_c8 + local_fa;
                                  puVar18 = local_108->base + uVar24;
                                  if ((ulong)((long)local_108->limit - (long)local_108->base) <=
                                      uVar24) {
                                    puVar18 = local_108->limit;
                                  }
                                  local_108->cursor = puVar18;
                                  iVar14 = 0;
                                }
                              }
                              else {
                                uVar26 = FVar11 & 0xfff;
                                if (uVar26 < local_f0->tuplecount) {
                                  memcpy(local_80,local_f0->tuplecoords +
                                                  uVar26 * local_f0->num_axis,
                                         (ulong)local_f0->num_axis << 3);
                                  pFVar28 = local_108;
                                  goto LAB_0025e629;
                                }
                                local_120 = 8;
                                iVar14 = 0xd;
                              }
                              if ((iVar14 != 0) && (iVar14 != 0x13)) {
                                if (iVar14 != 0xd) {
                                  return iVar14;
                                }
                                goto LAB_0025e46f;
                              }
                              uVar26 = (int)local_68 + 1;
                              local_68 = (ulong)uVar26;
                            } while (uVar26 != (uint)local_60);
                          }
                          uVar26 = pTVar5->variation_support;
                          uVar24 = local_b0 & 0xffffffff;
                          iVar14 = (int)local_b0;
                          if ((uVar26 & 2) != 0) {
                            *(undefined8 *)((long)local_d0 + uVar24 * 8) = 0;
                            *(undefined8 *)((long)local_e0 + uVar24 * 8) = 0;
                            *(undefined8 *)((long)local_d0 + (ulong)(iVar14 + 1) * 8) = 0;
                            *(undefined8 *)((long)local_e0 + (ulong)(iVar14 + 1) * 8) = 0;
                          }
                          if ((uVar26 & 0x10) != 0) {
                            *(undefined8 *)((long)local_d0 + (ulong)(iVar14 + 2) * 8) = 0;
                            *(undefined8 *)((long)local_e0 + (ulong)(iVar14 + 2) * 8) = 0;
                            *(undefined8 *)((long)local_d0 + (ulong)(iVar14 + 3) * 8) = 0;
                            *(undefined8 *)((long)local_e0 + (ulong)(iVar14 + 3) * 8) = 0;
                          }
                          if (local_11c != 0) {
                            pFVar15 = local_a8->points;
                            local_d8 = local_d8 << 3;
                            uVar21 = 0;
                            do {
                              plVar3 = (long *)((long)&unrounded->x + uVar21 * 2);
                              *plVar3 = *plVar3 + (*(long *)((long)local_d0 + uVar21) + 0x200 >> 10)
                              ;
                              plVar3 = (long *)((long)&unrounded->y + uVar21 * 2);
                              *plVar3 = *plVar3 + (*(long *)((long)local_e0 + uVar21) + 0x200 >> 10)
                              ;
                              plVar3 = (long *)((long)&pFVar15->x + uVar21 * 2);
                              *plVar3 = *plVar3 + ((*(long *)((long)local_d0 + uVar21) << 0x20) +
                                                   0x800000000000 >> 0x30);
                              plVar3 = (long *)((long)&pFVar15->y + uVar21 * 2);
                              *plVar3 = *plVar3 + ((*(long *)((long)local_e0 + uVar21) << 0x20) +
                                                   0x800000000000 >> 0x30);
                              uVar21 = uVar21 + 8;
                            } while (local_d8 != uVar21);
                          }
                          if ((uVar26 & 2) == 0) {
                            FVar9 = local_a8->points[uVar24].y;
                            (local_58->pp1).x = local_a8->points[uVar24].x;
                            (local_58->pp1).y = FVar9;
                            FVar9 = local_a8->points[iVar14 + 1U].y;
                            (local_58->pp2).x = local_a8->points[iVar14 + 1U].x;
                            (local_58->pp2).y = FVar9;
                            local_58->linear =
                                 (FT_Int)((unrounded[iVar14 + 1U].x - unrounded[uVar24].x) + 0x20U
                                         >> 6);
                          }
                          if ((pTVar5->variation_support & 0x10) == 0) {
                            FVar9 = local_a8->points[iVar14 + 2U].y;
                            (local_58->pp3).x = local_a8->points[iVar14 + 2U].x;
                            (local_58->pp3).y = FVar9;
                            FVar9 = local_a8->points[iVar14 + 3U].y;
                            (local_58->pp4).x = local_a8->points[iVar14 + 3U].x;
                            (local_58->pp4).y = FVar9;
                            local_58->vadvance =
                                 (FT_Int)((unrounded[iVar14 + 3U].y - unrounded[iVar14 + 2U].y) +
                                          0x20U >> 6);
                          }
                        }
LAB_0025e46f:
                        pFVar19 = local_118;
                        ft_mem_free(local_118,local_d0);
                        ft_mem_free(pFVar19,local_e0);
                        pFVar25 = local_88;
                        pFVar16 = local_90;
                        P_00 = local_78;
                      }
                    }
                    else {
                      P_00 = (FT_UShort *)0x0;
                    }
                  }
                  else {
                    pFVar16 = (FT_Fixed *)0x0;
                    P_00 = (FT_UShort *)0x0;
                  }
                }
                pFVar19 = local_118;
                if (P_00 != (FT_UShort *)0xffffffffffffffff) {
                  ft_mem_free(local_118,P_00);
                }
                ft_mem_free(pFVar19,local_80);
                ft_mem_free(pFVar19,pFVar25);
                ft_mem_free(pFVar19,pFVar16);
                FT_Stream_ExitFrame(local_108);
                pFVar15 = local_f8;
                P = local_e8;
              }
            }
          }
        }
        else {
          local_c0 = (FT_Bool *)0x0;
          pFVar15 = local_f8;
        }
      }
      ft_mem_free(pFVar19,pFVar15);
      ft_mem_free(pFVar19,P);
      ft_mem_free(pFVar19,local_c0);
      FVar13 = local_120;
    }
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Loader    loader,
                              FT_Outline*  outline,
                              FT_Vector*   unrounded )
  {
    FT_Error   error;
    TT_Face    face        = loader->face;
    FT_Stream  stream      = face->root.stream;
    FT_Memory  memory      = stream->memory;
    FT_UInt    glyph_index = loader->glyph_index;
    FT_UInt    n_points    = (FT_UInt)outline->n_points + 4;

    FT_Vector*  points_org = NULL;  /* coordinates in 16.16 format */
    FT_Vector*  points_out = NULL;  /* coordinates in 16.16 format */
    FT_Bool*    has_delta  = NULL;

    FT_ULong  glyph_start;

    FT_UInt   tupleCount;
    FT_ULong  offsetToData;
    FT_ULong  dataSize;

    FT_ULong  here;
    FT_UInt   i, j;

    FT_Fixed*  tuple_coords    = NULL;
    FT_Fixed*  im_start_coords = NULL;
    FT_Fixed*  im_end_coords   = NULL;

    GX_Blend  blend = face->blend;

    FT_UInt  point_count;
    FT_UInt  spoint_count = 0;

    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;

    FT_Fixed*  deltas_x       = NULL;
    FT_Fixed*  deltas_y       = NULL;
    FT_Fixed*  point_deltas_x = NULL;
    FT_Fixed*  point_deltas_y = NULL;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x = INT_TO_F26DOT6( outline->points[i].x );
      unrounded[i].y = INT_TO_F26DOT6( outline->points[i].y );
    }

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for glyph %d\n", glyph_index ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    dataSize = blend->glyphoffsets[glyph_index + 1] -
                 blend->glyphoffsets[glyph_index];

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] ) ||
         FT_FRAME_ENTER( dataSize )                         )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData > dataSize                                ||
         ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 > dataSize )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    if ( FT_NEW_ARRAY( point_deltas_x, n_points ) ||
         FT_NEW_ARRAY( point_deltas_y, n_points ) )
      goto Fail3;

    for ( j = 0; j < n_points; j++ )
    {
      points_org[j].x = FT_intToFixed( outline->points[j].x );
      points_org[j].y = FT_intToFixed( outline->points[j].y );
    }

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail3;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          blend->tuplecoords +
            ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) * blend->num_axis,
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Fixed  point_delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Fixed  point_delta_y = FT_MulFix( deltas_y[j], apply );


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Pos  point_delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  point_delta_y = points_out[j].y - points_org[j].y;


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

    /* To avoid double adjustment of advance width or height, */
    /* do not move phantom points if there is HVAR or VVAR    */
    /* support, respectively.                                 */
    if ( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )
    {
      point_deltas_x[n_points - 4] = 0;
      point_deltas_y[n_points - 4] = 0;
      point_deltas_x[n_points - 3] = 0;
      point_deltas_y[n_points - 3] = 0;
    }
    if ( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )
    {
      point_deltas_x[n_points - 2] = 0;
      point_deltas_y[n_points - 2] = 0;
      point_deltas_x[n_points - 1] = 0;
      point_deltas_y[n_points - 1] = 0;
    }

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x += FT_fixedToFdot6( point_deltas_x[i] );
      unrounded[i].y += FT_fixedToFdot6( point_deltas_y[i] );

      outline->points[i].x += FT_fixedToInt( point_deltas_x[i] );
      outline->points[i].y += FT_fixedToInt( point_deltas_y[i] );
    }

    /* To avoid double adjustment of advance width or height, */
    /* adjust phantom points only if there is no HVAR or VVAR */
    /* support, respectively.                                 */
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE ) )
    {
      loader->pp1      = outline->points[n_points - 4];
      loader->pp2      = outline->points[n_points - 3];
      loader->linear   = FT_PIX_ROUND( unrounded[n_points - 3].x -
                                       unrounded[n_points - 4].x ) / 64;
    }
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE ) )
    {
      loader->pp3      = outline->points[n_points - 2];
      loader->pp4      = outline->points[n_points - 1];
      loader->vadvance = FT_PIX_ROUND( unrounded[n_points - 1].y -
                                       unrounded[n_points - 2].y ) / 64;
    }

  Fail3:
    FT_FREE( point_deltas_x );
    FT_FREE( point_deltas_y );

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }